

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testClassification.cpp
# Opt level: O0

void anon_unknown.dwarf_ba0ec::testClass
               (half h,bool finite,bool normalized,bool denormalized,bool zero,bool nan,
               bool infinity,bool negative)

{
  bool bVar1;
  ostream *poVar2;
  byte in_CL;
  byte in_DL;
  byte in_SIL;
  uint16_t in_DI;
  byte in_R8B;
  byte in_R9B;
  byte in_stack_00000008;
  undefined2 in_stack_fffffffffffffff0;
  uint16_t uVar3;
  half hVar4;
  undefined1 in_stack_fffffffffffffff6;
  half local_2;
  
  local_2._h = in_DI;
  std::ios_base::width((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),0xf);
  std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),8);
  hVar4._h = local_2._h;
  poVar2 = (ostream *)::operator<<((ostream *)&std::cout,local_2);
  std::operator<<(poVar2,"    ");
  printBits((ostream *)&std::cout,local_2);
  std::operator<<((ostream *)&std::cout,"    ");
  bVar1 = Imath_3_2::half::isFinite((half *)0x1b1d1a);
  uVar3 = local_2._h;
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"finite ");
    uVar3 = local_2._h;
  }
  bVar1 = Imath_3_2::half::isNormalized
                    ((half *)CONCAT17(infinity,CONCAT16(in_stack_fffffffffffffff6,
                                                        CONCAT24(hVar4._h,CONCAT22(uVar3,
                                                  in_stack_fffffffffffffff0)))));
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"normalized ");
  }
  bVar1 = Imath_3_2::half::isDenormalized
                    ((half *)CONCAT17(infinity,CONCAT16(in_stack_fffffffffffffff6,
                                                        CONCAT24(hVar4._h,CONCAT22(uVar3,
                                                  in_stack_fffffffffffffff0)))));
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"denormalized ");
  }
  bVar1 = Imath_3_2::half::isZero(&local_2);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"zero ");
  }
  bVar1 = Imath_3_2::half::isNan
                    ((half *)CONCAT17(infinity,CONCAT16(in_stack_fffffffffffffff6,
                                                        CONCAT24(hVar4._h,CONCAT22(uVar3,
                                                  in_stack_fffffffffffffff0)))));
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"nan ");
  }
  bVar1 = Imath_3_2::half::isInfinity
                    ((half *)CONCAT17(infinity,CONCAT16(in_stack_fffffffffffffff6,
                                                        CONCAT24(hVar4._h,CONCAT22(uVar3,
                                                  in_stack_fffffffffffffff0)))));
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"infinity ");
  }
  bVar1 = Imath_3_2::half::isNegative(&local_2);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"negative ");
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  bVar1 = Imath_3_2::half::isFinite((half *)0x1b1e22);
  if (bVar1 != (bool)(in_SIL & 1)) {
    __assert_fail("h.isFinite () == finite",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testClassification.cpp"
                  ,0x3d,
                  "void (anonymous namespace)::testClass(half, bool, bool, bool, bool, bool, bool, bool)"
                 );
  }
  bVar1 = Imath_3_2::half::isNormalized
                    ((half *)CONCAT17(infinity,CONCAT16(in_stack_fffffffffffffff6,
                                                        CONCAT24(hVar4._h,CONCAT22(uVar3,
                                                  in_stack_fffffffffffffff0)))));
  if (bVar1 != (bool)(in_DL & 1)) {
    __assert_fail("h.isNormalized () == normalized",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testClassification.cpp"
                  ,0x3e,
                  "void (anonymous namespace)::testClass(half, bool, bool, bool, bool, bool, bool, bool)"
                 );
  }
  bVar1 = Imath_3_2::half::isDenormalized
                    ((half *)CONCAT17(infinity,CONCAT16(in_stack_fffffffffffffff6,
                                                        CONCAT24(hVar4._h,CONCAT22(uVar3,
                                                  in_stack_fffffffffffffff0)))));
  if (bVar1 != (bool)(in_CL & 1)) {
    __assert_fail("h.isDenormalized () == denormalized",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testClassification.cpp"
                  ,0x3f,
                  "void (anonymous namespace)::testClass(half, bool, bool, bool, bool, bool, bool, bool)"
                 );
  }
  bVar1 = Imath_3_2::half::isZero(&local_2);
  if (bVar1 != (bool)(in_R8B & 1)) {
    __assert_fail("h.isZero () == zero",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testClassification.cpp"
                  ,0x40,
                  "void (anonymous namespace)::testClass(half, bool, bool, bool, bool, bool, bool, bool)"
                 );
  }
  bVar1 = Imath_3_2::half::isNan
                    ((half *)CONCAT17(infinity,CONCAT16(in_stack_fffffffffffffff6,
                                                        CONCAT24(hVar4._h,CONCAT22(uVar3,
                                                  in_stack_fffffffffffffff0)))));
  if (bVar1 != (bool)(in_R9B & 1)) {
    __assert_fail("h.isNan () == nan",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testClassification.cpp"
                  ,0x41,
                  "void (anonymous namespace)::testClass(half, bool, bool, bool, bool, bool, bool, bool)"
                 );
  }
  bVar1 = Imath_3_2::half::isInfinity
                    ((half *)CONCAT17(infinity,CONCAT16(in_stack_fffffffffffffff6,
                                                        CONCAT24(hVar4._h,CONCAT22(uVar3,
                                                  in_stack_fffffffffffffff0)))));
  if (bVar1 != (bool)(in_stack_00000008 & 1)) {
    __assert_fail("h.isInfinity () == infinity",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testClassification.cpp"
                  ,0x42,
                  "void (anonymous namespace)::testClass(half, bool, bool, bool, bool, bool, bool, bool)"
                 );
  }
  bVar1 = Imath_3_2::half::isNegative(&local_2);
  if (bVar1 != (bool)(infinity & 1U)) {
    __assert_fail("h.isNegative () == negative",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testClassification.cpp"
                  ,0x43,
                  "void (anonymous namespace)::testClass(half, bool, bool, bool, bool, bool, bool, bool)"
                 );
  }
  return;
}

Assistant:

void
testClass (
    half h,
    bool finite,
    bool normalized,
    bool denormalized,
    bool zero,
    bool nan,
    bool infinity,
    bool negative)
{
    cout.width (15);
    cout.precision (8);

    cout << h << "    ";
    printBits (cout, h);
    cout << "    ";

    if (h.isFinite ()) cout << "finite ";

    if (h.isNormalized ()) cout << "normalized ";

    if (h.isDenormalized ()) cout << "denormalized ";

    if (h.isZero ()) cout << "zero ";

    if (h.isNan ()) cout << "nan ";

    if (h.isInfinity ()) cout << "infinity ";

    if (h.isNegative ()) cout << "negative ";

    cout << endl;

    assert (h.isFinite () == finite);
    assert (h.isNormalized () == normalized);
    assert (h.isDenormalized () == denormalized);
    assert (h.isZero () == zero);
    assert (h.isNan () == nan);
    assert (h.isInfinity () == infinity);
    assert (h.isNegative () == negative);
}